

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Net * __thiscall notch::core::MakeNet::make(Net *__return_storage_ptr__,MakeNet *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  logic_error *this_00;
  undefined1 local_118 [48];
  shared_ptr<notch::core::ALossLayer> local_e8;
  undefined1 local_d8 [48];
  shared_ptr<notch::core::ABackpropLayer> local_a8 [2];
  undefined1 local_88 [40];
  value_type lmaker;
  ulong uStack_28;
  value_type ltype;
  size_t i;
  MakeNet *this_local;
  Net *net;
  
  Net::Net(__return_storage_ptr__);
  for (uStack_28 = 0;
      sVar1 = std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::size
                        (&this->layerMakers), uStack_28 < sVar1; uStack_28 = uStack_28 + 1) {
    pvVar2 = std::
             vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
             ::operator[](&this->layerTypes,uStack_28);
    lmaker.maybeActivation._4_4_ = *pvVar2;
    pvVar3 = std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::
             operator[](&this->layerMakers,uStack_28);
    MakeLayer::MakeLayer((MakeLayer *)(local_88 + 0x20),pvVar3);
    switch(lmaker.maybeActivation._4_4_) {
    case FC:
      MakeLayer::FC((MakeLayer *)local_88);
      ::std::shared_ptr<notch::core::ABackpropLayer>::
      shared_ptr<notch::core::FullyConnectedLayer,void>
                ((shared_ptr<notch::core::ABackpropLayer> *)(local_88 + 0x10),
                 (shared_ptr<notch::core::FullyConnectedLayer> *)local_88);
      Net::append(__return_storage_ptr__,
                  (shared_ptr<notch::core::ABackpropLayer> *)(local_88 + 0x10));
      std::shared_ptr<notch::core::ABackpropLayer>::~shared_ptr
                ((shared_ptr<notch::core::ABackpropLayer> *)(local_88 + 0x10));
      std::shared_ptr<notch::core::FullyConnectedLayer>::~shared_ptr
                ((shared_ptr<notch::core::FullyConnectedLayer> *)local_88);
      break;
    case Activation:
      MakeLayer::activation((MakeLayer *)(local_d8 + 0x20));
      ::std::shared_ptr<notch::core::ABackpropLayer>::shared_ptr<notch::core::ActivationLayer,void>
                (local_a8,(shared_ptr<notch::core::ActivationLayer> *)(local_d8 + 0x20));
      Net::append(__return_storage_ptr__,local_a8);
      std::shared_ptr<notch::core::ABackpropLayer>::~shared_ptr(local_a8);
      std::shared_ptr<notch::core::ActivationLayer>::~shared_ptr
                ((shared_ptr<notch::core::ActivationLayer> *)(local_d8 + 0x20));
      break;
    case L2Loss:
      MakeLayer::L2Loss((MakeLayer *)local_d8);
      ::std::shared_ptr<notch::core::ALossLayer>::shared_ptr<notch::core::EuclideanLoss,void>
                ((shared_ptr<notch::core::ALossLayer> *)(local_d8 + 0x10),
                 (shared_ptr<notch::core::EuclideanLoss> *)local_d8);
      Net::append(__return_storage_ptr__,(shared_ptr<notch::core::ALossLayer> *)(local_d8 + 0x10));
      std::shared_ptr<notch::core::ALossLayer>::~shared_ptr
                ((shared_ptr<notch::core::ALossLayer> *)(local_d8 + 0x10));
      std::shared_ptr<notch::core::EuclideanLoss>::~shared_ptr
                ((shared_ptr<notch::core::EuclideanLoss> *)local_d8);
      break;
    case Softmax:
      MakeLayer::softmax((MakeLayer *)(local_118 + 0x20));
      ::std::shared_ptr<notch::core::ALossLayer>::shared_ptr<notch::core::SoftmaxWithLoss,void>
                (&local_e8,(shared_ptr<notch::core::SoftmaxWithLoss> *)(local_118 + 0x20));
      Net::append(__return_storage_ptr__,&local_e8);
      std::shared_ptr<notch::core::ALossLayer>::~shared_ptr(&local_e8);
      std::shared_ptr<notch::core::SoftmaxWithLoss>::~shared_ptr
                ((shared_ptr<notch::core::SoftmaxWithLoss> *)(local_118 + 0x20));
      break;
    case Hinge:
      MakeLayer::hinge((MakeLayer *)local_118);
      ::std::shared_ptr<notch::core::ALossLayer>::shared_ptr<notch::core::HingeLoss,void>
                ((shared_ptr<notch::core::ALossLayer> *)(local_118 + 0x10),
                 (shared_ptr<notch::core::HingeLoss> *)local_118);
      Net::append(__return_storage_ptr__,(shared_ptr<notch::core::ALossLayer> *)(local_118 + 0x10));
      std::shared_ptr<notch::core::ALossLayer>::~shared_ptr
                ((shared_ptr<notch::core::ALossLayer> *)(local_118 + 0x10));
      std::shared_ptr<notch::core::HingeLoss>::~shared_ptr
                ((shared_ptr<notch::core::HingeLoss> *)local_118);
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      ::std::logic_error::logic_error(this_00,"unsupported layer type");
      __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
    }
    MakeLayer::~MakeLayer((MakeLayer *)(local_88 + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

Net make() {
        Net net;
        for (size_t i = 0; i < layerMakers.size(); ++i) {
            auto ltype = layerTypes[i];
            auto lmaker = layerMakers[i];
            switch (ltype) {
                case LayerType::FC:
                    net.append(lmaker.FC()); break;
                case LayerType::Activation:
                    net.append(lmaker.activation()); break;
                case LayerType::L2Loss:
                    net.append(lmaker.L2Loss()); break;
                case LayerType::Softmax:
                    net.append(lmaker.softmax()); break;
                case LayerType::Hinge:
                    net.append(lmaker.hinge()); break;
                default:
                    throw std::logic_error("unsupported layer type"); break;
            }
        }
        return net;
    }